

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode
DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint32_t *value)

{
  BrotliRunningDecodeUint8State BVar1;
  ulong uVar2;
  byte *pbVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t in_R8D;
  size_t sVar7;
  uint64_t uVar8;
  bool bVar9;
  
  BVar1 = s->substate_decode_uint8;
  if (BVar1 == BROTLI_STATE_DECODE_UINT8_LONG) goto LAB_00102b6b;
  if (BVar1 != BROTLI_STATE_DECODE_UINT8_SHORT) {
    if (BVar1 != BROTLI_STATE_DECODE_UINT8_NONE) {
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    uVar4 = br->bit_pos_;
    bVar9 = uVar4 == 0x40;
    if (bVar9) {
      if (br->avail_in != 0) {
        uVar2 = br->val_;
        br->val_ = uVar2 >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | uVar2 >> 8;
        uVar4 = 0x38;
        br->bit_pos_ = 0x38;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        bVar9 = false;
        goto LAB_00102ad9;
      }
      in_R8D = 0;
    }
    else {
LAB_00102ad9:
      in_R8D = (uint32_t)((br->val_ >> ((ulong)uVar4 & 0x3f) & 1) != 0);
      br->bit_pos_ = uVar4 + 1;
    }
    if (bVar9) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (in_R8D == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  uVar5 = br->bit_pos_;
  bVar9 = uVar5 - 0x3e < 3;
  if (bVar9) {
    if (br->avail_in != 0) {
      uVar2 = br->val_;
      br->val_ = uVar2 >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | uVar2 >> 8;
      uVar5 = uVar5 - 8;
      br->bit_pos_ = uVar5;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
      bVar9 = false;
      goto LAB_00102b47;
    }
  }
  else {
LAB_00102b47:
    in_R8D = (uint)(br->val_ >> ((byte)uVar5 & 0x3f)) & 7;
    br->bit_pos_ = uVar5 + 3;
  }
  if (bVar9) {
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  if (in_R8D == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = in_R8D;
LAB_00102b6b:
  uVar4 = *value;
  uVar5 = br->bit_pos_;
  bVar9 = 0x40 - uVar5 < uVar4;
  if (bVar9) {
    sVar7 = br->avail_in;
    if (sVar7 != 0) {
      uVar8 = br->val_;
      uVar6 = 0x48 - uVar5;
      pbVar3 = br->next_in;
      do {
        uVar5 = uVar5 - 8;
        sVar7 = sVar7 - 1;
        br->val_ = uVar8 >> 8;
        uVar8 = (ulong)*pbVar3 << 0x38 | uVar8 >> 8;
        br->val_ = uVar8;
        br->bit_pos_ = uVar5;
        br->avail_in = sVar7;
        br->next_in = pbVar3 + 1;
        bVar9 = uVar6 < uVar4;
        if (!bVar9) goto LAB_00102bdd;
        uVar6 = uVar6 + 8;
        pbVar3 = pbVar3 + 1;
      } while (sVar7 != 0);
    }
  }
  else {
LAB_00102bdd:
    in_R8D = (uint)(br->val_ >> ((byte)uVar5 & 0x3f)) & kBitMask[uVar4];
    br->bit_pos_ = uVar4 + uVar5;
  }
  if (bVar9) {
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  *value = (1 << ((byte)*value & 0x1f)) + in_R8D;
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(
    BrotliDecoderState* s, BrotliBitReader* br, uint32_t* value) {
  uint32_t bits;
  switch (s->substate_decode_uint8) {
    case BROTLI_STATE_DECODE_UINT8_NONE:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 0;
        return BROTLI_DECODER_SUCCESS;
      }
      /* No break, transit to the next state. */

    case BROTLI_STATE_DECODE_UINT8_SHORT:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 1;
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
        return BROTLI_DECODER_SUCCESS;
      }
      /* Use output value as a temporary storage. It MUST be persisted. */
      *value = bits;
      /* No break, transit to the next state. */

    case BROTLI_STATE_DECODE_UINT8_LONG:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *value = (1U << *value) + bits;
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
      return BROTLI_DECODER_SUCCESS;

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}